

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::ResponsesCache::Eliminate(ResponsesCache *this)

{
  char cVar1;
  iterator __position;
  char *from;
  char *to;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator local_109;
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
  *local_108;
  long local_100;
  writer write;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_d8;
  string local_88;
  utils local_68 [24];
  string local_50;
  
  local_100 = std::chrono::_V2::system_clock::now();
  local_108 = (_Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
               *)&this->mContainer;
  do {
    if (((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (__position._M_node = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       , local_100 < *(long *)(__position._M_node + 1))) {
      return;
    }
    std::
    _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
    ::erase_abi_cxx11_(local_108,__position);
    std::__cxx11::string::string((string *)&local_88,"coap",&local_109);
    local_d8.types_[0] = pointer_type;
    local_d8.types_[1] = string_type;
    local_d8.types_[2] = uint_type;
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "server(={}) remove response cache: token={}, messageId={}";
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x39;
    local_d8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_d8.context_.super_basic_format_parse_context<char>._20_4_ = 3;
    write.handler_ = &local_d8;
    local_d8.parse_funcs_[2] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_d8.parse_funcs_[0] =
         ::fmt::v10::detail::parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_d8.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    from = "server(={}) remove response cache: token={}, messageId={}";
    local_d8.context_.types_ = (write.handler_)->types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()(&write,from,"");
          goto LAB_0014555b;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
      ::writer::operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,unsigned_short>&>
                       (to,"",&local_d8);
    }
LAB_0014555b:
    Message::GetToken((ByteArray *)local_68,(Message *)&__position._M_node[1]._M_parent);
    utils::Hex_abi_cxx11_((string *)&write,local_68,aBytes);
    local_d8.context_.super_basic_format_parse_context<char>._16_8_ =
         ZEXT28(*(ushort *)((long)&__position._M_node[1]._M_parent + 2));
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)write.handler_;
    fmt.size_ = 0x2de;
    fmt.data_ = (char *)0x39;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_d8;
    local_d8.types_._0_8_ = this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"server(={}) remove response cache: token={}, messageId={}",fmt,args
              );
    Log(kInfo,&local_88,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&write);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    std::__cxx11::string::~string((string *)&local_88);
  } while( true );
}

Assistant:

void Coap::ResponsesCache::Eliminate()
{
    auto now = Clock::now();

    while (!mContainer.empty())
    {
        auto  earliest = mContainer.begin();
        auto  deadTime = earliest->first;
        auto &response = earliest->second;
        if (deadTime > now)
        {
            break;
        }
        mContainer.erase(earliest);
        LOG_INFO(LOG_REGION_COAP, "server(={}) remove response cache: token={}, messageId={}",
                 static_cast<void *>(this), utils::Hex(response.GetToken()), response.GetMessageId());
    }
}